

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_curv_vert_tangents_dim<2>
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_tangents,
          LOs *curv_vert2vert)

{
  bool bVar1;
  Int IVar2;
  LO n;
  LO nb;
  undefined8 uVar3;
  void *extraout_RDX;
  char *pcVar4;
  Reals RVar5;
  Reals curv_vert_tangents;
  LOs edge2curv_edge;
  Read<signed_char> arcs2flip;
  Write<double> arcs2tangents_w;
  Write<double> local_280;
  Write<int> local_270;
  Write<double> local_260;
  undefined1 local_250 [64];
  Reals weights;
  Write<double> local_200;
  Reals arcs2tangents;
  Write<int> local_1e0;
  Write<int> local_1d0;
  Write<int> local_1c0;
  Adj curv_verts2edges;
  type f;
  Graph local_110;
  Adj local_f0;
  Adj local_c0;
  Adj local_90;
  Adj verts2edges;
  
  IVar2 = Mesh::dim(mesh);
  if (IVar2 == 2) {
    bVar1 = Mesh::owners_have_all_upward(mesh,0);
    if (bVar1) {
      Mesh::ask_up(&verts2edges,mesh,0,1);
      Write<int>::Write(&local_1c0,&curv_vert2vert->write_);
      Adj::Adj(&local_90,&verts2edges);
      unmap_adjacency(&curv_verts2edges,(LOs *)&local_1c0,&local_90);
      Adj::~Adj(&local_90);
      Write<int>::~Write(&local_1c0);
      n = Graph::nedges(&curv_verts2edges.super_Graph);
      Write<int>::Write(&local_1d0,&curv_edge2edge->write_);
      nb = Mesh::nedges(mesh);
      invert_injective_map((Omega_h *)&edge2curv_edge,(LOs *)&local_1d0,nb);
      Write<int>::~Write(&local_1d0);
      std::__cxx11::string::string((string *)&f,"",(allocator *)&arcs2flip);
      Write<double>::Write(&arcs2tangents_w,n * 2,(string *)&f);
      std::__cxx11::string::~string((string *)&f);
      Adj::Adj(&local_c0,&curv_verts2edges);
      Write<int>::Write(&local_1e0,&edge2curv_edge.write_);
      get_curv_vert_edge_flips((Omega_h *)&arcs2flip,&local_c0,(LOs *)&local_1e0);
      Write<int>::~Write(&local_1e0);
      Adj::~Adj(&local_c0);
      Adj::Adj(&f.curv_verts2edges,&curv_verts2edges);
      Write<int>::Write(&f.edge2curv_edge.write_,&edge2curv_edge.write_);
      Write<double>::Write(&f.arcs2tangents_w,&arcs2tangents_w);
      Write<double>::Write(&f.curv_edge_tangents.write_,&curv_edge_tangents->write_);
      Write<signed_char>::Write(&f.arcs2flip.write_,&arcs2flip.write_);
      parallel_for<Omega_h::get_curv_vert_tangents_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)::_lambda(int)_1_>
                (n,&f,"get_curv_vert_tangents");
      Write<double>::Write(&local_200,&arcs2tangents_w);
      Read<double>::Read((Read<signed_char> *)&arcs2tangents,&local_200);
      Write<double>::~Write(&local_200);
      Adj::Adj(&local_f0,&curv_verts2edges);
      Write<int>::Write((Write<int> *)(local_250 + 0x30),&edge2curv_edge.write_);
      get_recip_length_weights((Omega_h *)&weights,mesh,&local_f0,(LOs *)(local_250 + 0x30));
      Write<int>::~Write((Write<int> *)(local_250 + 0x30));
      Adj::~Adj(&local_f0);
      Graph::Graph(&local_110,&curv_verts2edges.super_Graph);
      Write<double>::Write((Write<double> *)(local_250 + 0x20),&weights.write_);
      Write<double>::Write((Write<double> *)(local_250 + 0x10),&arcs2tangents.write_);
      graph_weighted_average_arc_data
                ((Omega_h *)&curv_vert_tangents,&local_110,(Reals *)(local_250 + 0x20),
                 (Reals *)(local_250 + 0x10),2);
      Write<double>::~Write((Write<double> *)(local_250 + 0x10));
      Write<double>::~Write((Write<double> *)(local_250 + 0x20));
      Graph::~Graph(&local_110);
      Write<double>::Write(&local_260,&curv_vert_tangents.write_);
      Write<int>::Write(&local_270,&curv_vert2vert->write_);
      Mesh::sync_subset_array<double>
                ((Mesh *)local_250,(Int)mesh,(Read<double> *)0x0,(LOs *)&local_260,0.0,
                 (Int)&local_270);
      Write<double>::operator=(&curv_vert_tangents.write_,(Write<signed_char> *)local_250);
      Write<double>::~Write((Write<double> *)local_250);
      Write<int>::~Write(&local_270);
      Write<double>::~Write(&local_260);
      Write<double>::Write(&local_280,&curv_vert_tangents.write_);
      normalize_vectors(this,(Reals *)&local_280,2);
      Write<double>::~Write(&local_280);
      Write<double>::~Write(&curv_vert_tangents.write_);
      Write<double>::~Write(&weights.write_);
      Write<double>::~Write(&arcs2tangents.write_);
      get_curv_vert_tangents_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)
      ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
      Write<signed_char>::~Write(&arcs2flip.write_);
      Write<double>::~Write(&arcs2tangents_w);
      Write<int>::~Write(&edge2curv_edge.write_);
      Adj::~Adj(&curv_verts2edges);
      Adj::~Adj(&verts2edges);
      RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
      RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Reals)RVar5.write_.shared_alloc_;
    }
    pcVar4 = "mesh->owners_have_all_upward(VERT)";
    uVar3 = 0x10a;
  }
  else {
    pcVar4 = "mesh->dim() == dim";
    uVar3 = 0x109;
  }
  fail("assertion %s failed at %s +%d\n",pcVar4,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
       ,uVar3);
}

Assistant:

Reals get_curv_vert_tangents_dim(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_tangents, LOs curv_vert2vert) {
  OMEGA_H_CHECK(mesh->dim() == dim);
  OMEGA_H_CHECK(mesh->owners_have_all_upward(VERT));
  auto verts2edges = mesh->ask_up(VERT, EDGE);
  auto curv_verts2edges = unmap_adjacency(curv_vert2vert, verts2edges);
  auto narcs = curv_verts2edges.nedges();
  auto edge2curv_edge = invert_injective_map(curv_edge2edge, mesh->nedges());
  auto arcs2tangents_w = Write<Real>(narcs * dim);
  auto arcs2flip = get_curv_vert_edge_flips(curv_verts2edges, edge2curv_edge);
  auto f = OMEGA_H_LAMBDA(LO arc) {
    auto e = curv_verts2edges.ab2b[arc];
    auto ce = edge2curv_edge[e];
    if (-1 == ce)
      set_vector(arcs2tangents_w, arc, zero_vector<dim>());
    else {
      auto tangent = get_vector<dim>(curv_edge_tangents, ce);
      if (arcs2flip[arc]) tangent = -tangent;
      set_vector(arcs2tangents_w, arc, tangent);
    }
  };
  parallel_for(narcs, f, "get_curv_vert_tangents");
  auto arcs2tangents = Reals(arcs2tangents_w);
  auto weights =
      get_recip_length_weights(mesh, curv_verts2edges, edge2curv_edge);
  auto curv_vert_tangents = graph_weighted_average_arc_data(
      curv_verts2edges, weights, arcs2tangents, dim);
  curv_vert_tangents = mesh->sync_subset_array(
      VERT, curv_vert_tangents, curv_vert2vert, 0.0, dim);
  return normalize_vectors(curv_vert_tangents, dim);
}